

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  string *__range2;
  ulong uVar8;
  undefined8 uVar9;
  size_type sVar10;
  char cVar11;
  ulong *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  FilePath local_f8;
  int local_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  local_d4 = number;
  if (number == 0) {
    pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    paVar2 = &local_f8.pathname_.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_f8.pathname_.field_2._8_8_ = plVar5[3];
      local_f8.pathname_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f8.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_f8.pathname_._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8.pathname_._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8.pathname_._M_dataplus._M_p);
    }
    puVar12 = local_d0;
    if (local_d0 == &local_c0) goto LAB_001324f7;
  }
  else {
    pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    StreamableToString<int>(&local_50,&local_d4);
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if (uVar8 < local_50._M_string_length + local_88) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar9 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_50._M_string_length + local_88) goto LAB_00132314;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00132314:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
    }
    local_b0 = &local_a0;
    puVar1 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar1) {
      local_a0 = *puVar1;
      uStack_98 = puVar4[3];
    }
    else {
      local_a0 = *puVar1;
      local_b0 = (undefined8 *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar12 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar12) {
      local_c0 = *puVar12;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar12;
      local_d0 = (ulong *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)puVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    paVar2 = &local_f8.pathname_.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_f8.pathname_.field_2._8_8_ = puVar4[3];
      local_f8.pathname_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f8.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_f8.pathname_._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_f8.pathname_._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8.pathname_._M_dataplus._M_p);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    puVar12 = local_90;
    if (local_90 == local_80) goto LAB_001324f7;
  }
  operator_delete(puVar12);
LAB_001324f7:
  paVar2 = &local_f8.pathname_.field_2;
  local_f8.pathname_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_70,local_70 + local_68);
  _Var7._M_p = local_f8.pathname_._M_dataplus._M_p;
  if (local_f8.pathname_._M_string_length != 0) {
    sVar10 = 0;
    do {
      cVar11 = local_f8.pathname_._M_dataplus._M_p[sVar10];
      if (((cVar11 != '/') || (cVar11 = '/', _Var7._M_p == local_f8.pathname_._M_dataplus._M_p)) ||
         (_Var7._M_p[-1] != '/')) {
        *_Var7._M_p = cVar11;
        _Var7._M_p = _Var7._M_p + 1;
      }
      sVar10 = sVar10 + 1;
    } while (local_f8.pathname_._M_string_length != sVar10);
  }
  local_f8.pathname_._M_string_length = (long)_Var7._M_p - (long)local_f8.pathname_._M_dataplus._M_p
  ;
  *_Var7._M_p = '\0';
  ConcatPaths(__return_storage_ptr__,directory,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.pathname_._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.pathname_._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}